

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoop::handleRead(EventLoop *this)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  self *psVar4;
  LogStream *pLVar5;
  uint v;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  Logger local_1030;
  undefined1 local_60 [12];
  undefined1 local_50 [12];
  undefined1 local_40 [12];
  undefined1 local_30 [12];
  undefined8 local_20;
  uint64_t one;
  
  local_20 = 1;
  sVar3 = read(this->m_wakeupFd,&local_20,8);
  v = (uint)sVar3;
  if ((int)v < 1) {
    if (v == 0) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_50,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                );
      file_01._12_4_ = 0;
      file_01.m_data = (char *)local_50._0_8_;
      file_01.m_size = local_50._8_4_;
      Logger::Logger(&local_1030,file_01,0x121,ERROR);
      LogStream::operator<<
                (&local_1030.m_impl.m_stream,"EventLoop::handleRead() m_wakeupFd has been closed");
    }
    else {
      iVar2 = sz_getlasterr();
      if ((iVar2 == 4) || (bVar1 = sockets::sz_wouldblock(), bVar1)) {
        Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_40,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                  );
        file_00._12_4_ = 0;
        file_00.m_data = (char *)local_40._0_8_;
        file_00.m_size = local_40._8_4_;
        Logger::Logger(&local_1030,file_00,0x127,WARN);
        psVar4 = LogStream::operator<<
                           (&local_1030.m_impl.m_stream,
                            "EventLoop::handleRead() recv sz_getlasterr() rst ");
        iVar2 = sz_getlasterr();
        pLVar5 = LogStream::operator<<(psVar4,iVar2);
        LogStream::operator<<(pLVar5," is sz_err_eintr or sockets::sz_wouldblock()");
      }
      else {
        Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_30,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                  );
        file_02._12_4_ = 0;
        file_02.m_data = (char *)local_30._0_8_;
        file_02.m_size = local_30._8_4_;
        Logger::Logger(&local_1030,file_02,300,ERROR);
        LogStream::operator<<(&local_1030.m_impl.m_stream,"EventLoop::handleRead() recv error");
      }
    }
  }
  else {
    if ((v & 0x7fffffff) == 8) {
      return;
    }
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_60,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_60._0_8_;
    file.m_size = local_60._8_4_;
    Logger::Logger(&local_1030,file,0x11b,ERROR);
    psVar4 = LogStream::operator<<(&local_1030.m_impl.m_stream,"EventLoop::handleRead() reads ");
    pLVar5 = LogStream::operator<<(psVar4,v);
    LogStream::operator<<(pLVar5," bytes instead of 8");
  }
  Logger::~Logger(&local_1030);
  return;
}

Assistant:

void EventLoop::handleRead()
{
	uint64_t one = 1;
	int n = 0;
#if defined(SZ_OS_WINDOWS)
	n = ::recv(m_wakeupFd.event_read, reinterpret_cast<char*>(&one), sizeof(one), 0);
#else
	n = ::read(m_wakeupFd, (char*)&one, sizeof(one));
#endif
	if (n > 0)
	{
		if (n != sizeof(one))
		{
			LOG_ERROR << "EventLoop::handleRead() reads " << n << " bytes instead of 8";
		}
		return;
	}
	else if (n == 0)
	{
		LOG_ERROR << "EventLoop::handleRead() m_wakeupFd has been closed";
	}
	else
	{
		if (sz_getlasterr() == sz_err_eintr || sockets::sz_wouldblock())
		{
			LOG_WARN << "EventLoop::handleRead() recv sz_getlasterr() rst " 
				<< sz_getlasterr() 
				<< " is sz_err_eintr or sockets::sz_wouldblock()";
			return;
		}
		LOG_ERROR << "EventLoop::handleRead() recv error";
	}
}